

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

bool ExprEval::Operator::remove_custom_operator(string *custom_symbol)

{
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *this;
  size_t __lhs;
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  __normal_iterator<ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
  local_38;
  __normal_iterator<ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
  local_30;
  const_iterator local_28;
  ulong local_20;
  size_t i;
  string *custom_symbol_local;
  
  i = (size_t)custom_symbol;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    for (local_20 = 0; uVar2 = local_20,
        sVar3 = std::
                vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
                ::size(custom_operator_table), __lhs = i, uVar2 < sVar3; local_20 = local_20 + 1) {
      pvVar4 = std::
               vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
               ::at(custom_operator_table,local_20);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,&pvVar4->symbol);
      this = custom_operator_table;
      if (_Var1) {
        local_38._M_current =
             (CustomOperator *)
             std::
             vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
             ::begin(custom_operator_table);
        local_30 = __gnu_cxx::
                   __normal_iterator<ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
                   ::operator+(&local_38,local_20);
        __gnu_cxx::
        __normal_iterator<ExprEval::Operator::CustomOperator_const*,std::vector<ExprEval::Operator::CustomOperator,std::allocator<ExprEval::Operator::CustomOperator>>>
        ::__normal_iterator<ExprEval::Operator::CustomOperator*>
                  ((__normal_iterator<ExprEval::Operator::CustomOperator_const*,std::vector<ExprEval::Operator::CustomOperator,std::allocator<ExprEval::Operator::CustomOperator>>>
                    *)&local_28,&local_30);
        std::
        vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
        ::erase(this,local_28);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool remove_custom_operator(const std::string& custom_symbol){
            if(custom_symbol.empty()) return false;
            for(size_t i=0; i<custom_operator_table->size(); ++i){
                if(custom_symbol == custom_operator_table->at(i).symbol){
                    custom_operator_table->erase(custom_operator_table->begin()+i);
                    return true;
                }
            }
            return false;
        }